

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_tail_multiple.h
# Opt level: O2

ControlBlock * __thiscall
density::detail::
SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
::create_initial_page
          (SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  ControlBlock *pCVar1;
  
  pCVar1 = create_page(this,i_progress_guarantee);
  if (pCVar1 != (ControlBlock *)0x0) {
    if ((this->m_initial_page)._M_b._M_p != (__pointer_type)0x0) {
      density_tests::detail::assert_failed<>
                ("m_initial_page.load() == nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
                 ,0x176);
    }
    LOCK();
    (this->m_initial_page)._M_b._M_p = pCVar1;
    UNLOCK();
    if (this->m_tail != (ControlBlock *)0xffc0) {
      density_tests::detail::assert_failed<>
                ("m_tail == invalid_control_block()",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
                 ,0x17a);
    }
    this->m_tail = pCVar1;
  }
  return pCVar1;
}

Assistant:

ControlBlock * create_initial_page(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                // m_initial_page = initial_page = create_page()
                auto const initial_page = create_page(i_progress_guarantee);
                if (initial_page == nullptr)
                {
                    return nullptr;
                }
                DENSITY_ASSERT_INTERNAL(m_initial_page.load() == nullptr);
                m_initial_page.store(initial_page);

                // m_tail = initial_page;
                DENSITY_ASSERT_INTERNAL(m_tail == invalid_control_block());
                m_tail = initial_page;

                return m_tail;
            }